

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

void ShaderProgramDestroy(ShaderProgram *shader_program)

{
  if (shader_program->Handle != 0) {
    (*glad_glDeleteProgram)(shader_program->Handle);
  }
  if (shader_program->VertexShaderHandle != 0) {
    (*glad_glDeleteShader)(shader_program->VertexShaderHandle);
  }
  if (shader_program->FragmentShaderHandle != 0) {
    (*glad_glDeleteShader)(shader_program->FragmentShaderHandle);
    return;
  }
  return;
}

Assistant:

void ShaderProgramDestroy(ShaderProgram& shader_program) {
    if (shader_program.Handle) {
        glDeleteProgram(shader_program.Handle);
    }

    if (shader_program.VertexShaderHandle) {
        glDeleteShader(shader_program.VertexShaderHandle);
    }

    if (shader_program.FragmentShaderHandle) {
        glDeleteShader(shader_program.FragmentShaderHandle);
    }
}